

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::SCN
          (AbstractContentContext *this,double *inColorComponents,int inColorComponentsLength,
          string *inPatternName)

{
  EStatusCode EVar1;
  allocator<char> local_51;
  string local_50;
  int local_2c;
  string *psStack_28;
  int i;
  string *inPatternName_local;
  double *pdStack_18;
  int inColorComponentsLength_local;
  double *inColorComponents_local;
  AbstractContentContext *this_local;
  
  psStack_28 = inPatternName;
  inPatternName_local._4_4_ = inColorComponentsLength;
  pdStack_18 = inColorComponents;
  inColorComponents_local = (double *)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  for (local_2c = 0; local_2c < inPatternName_local._4_4_; local_2c = local_2c + 1) {
    PrimitiveObjectsWriter::WriteDouble
              (&this->mPrimitiveWriter,pdStack_18[local_2c],eTokenSeparatorSpace);
  }
  PrimitiveObjectsWriter::WriteName(&this->mPrimitiveWriter,psStack_28,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"SCN",&local_51);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::SCN(double* inColorComponents, int inColorComponentsLength,const std::string& inPatternName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	for(int i=0;i<inColorComponentsLength;++i)
		mPrimitiveWriter.WriteDouble(inColorComponents[i]);
	mPrimitiveWriter.WriteName(inPatternName);
	mPrimitiveWriter.WriteKeyword("SCN");
	return GetCurrentStatusCode();
}